

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void md5_str(MD5_DIGEST digest,char *str,size_t max_len)

{
  long in_FS_OFFSET;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_10 = digest.data._8_8_;
  local_18 = digest.data._0_8_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  digest_str((uchar *)&local_18,0x10,str,max_len);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void md5_str(MD5_DIGEST digest, char *str, size_t max_len)
{
	digest_str(digest.data, sizeof(digest.data), str, max_len);
}